

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModuleManager.cpp
# Opt level: O1

void __thiscall luna::ModuleManager::Load(ModuleManager *this,Lexer *lexer)

{
  SyntaxTree *in_RAX;
  pointer *__ptr;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> ast;
  SyntaxTree *local_18;
  
  local_18 = in_RAX;
  Parse((luna *)&local_18,lexer);
  SemanticAnalysis(local_18,this->state_);
  CodeGenerate(local_18,this->state_);
  if (local_18 != (SyntaxTree *)0x0) {
    (*local_18->_vptr_SyntaxTree[1])();
  }
  return;
}

Assistant:

void ModuleManager::Load(Lexer &lexer)
    {
        // Parse to AST
        auto ast = Parse(&lexer);

        // Semantic analysis
        SemanticAnalysis(ast.get(), state_);

        // Generate code
        CodeGenerate(ast.get(), state_);
    }